

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderSwitchTests.cpp
# Opt level: O2

TestCase *
deqp::gles3::Functional::makeSwitchCase
          (Context *context,char *name,char *desc,SwitchType type,bool isVertex,
          LineStream *switchBody)

{
  ostream *poVar1;
  mapped_type *pmVar2;
  ShaderSwitchCase *this;
  code *evalFunc;
  code *pcVar3;
  char *pcVar4;
  ostringstream *poVar5;
  allocator<char> local_3c1;
  key_type local_3c0;
  StringTemplate local_3a0;
  char *local_380;
  char *local_378;
  string local_370;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  params;
  ostringstream vtx;
  ostringstream frag;
  
  local_380 = name;
  local_378 = desc;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vtx);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
  poVar5 = (ostringstream *)&frag;
  if (isVertex) {
    poVar5 = (ostringstream *)&vtx;
  }
  poVar1 = std::operator<<((ostream *)&vtx,"#version 300 es\n");
  poVar1 = std::operator<<(poVar1,"in highp vec4 a_position;\n");
  std::operator<<(poVar1,"in highp vec4 a_coords;\n");
  poVar1 = std::operator<<((ostream *)&frag,"#version 300 es\n");
  std::operator<<(poVar1,"layout(location = 0) out mediump vec4 o_color;\n");
  if (isVertex) {
    std::operator<<((ostream *)&vtx,"out mediump vec4 v_color;\n");
    pcVar4 = "in mediump vec4 v_color;\n";
  }
  else {
    std::operator<<((ostream *)&vtx,"out highp vec4 v_coords;\n");
    pcVar4 = "in highp vec4 v_coords;\n";
  }
  std::operator<<((ostream *)&frag,pcVar4);
  if (type == SWITCHTYPE_UNIFORM) {
    std::operator<<((ostream *)poVar5,"uniform highp int ui_two;\n");
  }
  poVar1 = std::operator<<((ostream *)&vtx,"\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  poVar1 = std::operator<<(poVar1,"{\n");
  std::operator<<(poVar1,"\tgl_Position = a_position;\n");
  poVar1 = std::operator<<((ostream *)&frag,"\n");
  poVar1 = std::operator<<(poVar1,"void main (void)\n");
  std::operator<<(poVar1,"{\n");
  poVar1 = std::operator<<((ostream *)poVar5,"\thighp vec4 coords = ");
  pcVar4 = "v_coords";
  if (isVertex) {
    pcVar4 = "a_coords";
  }
  poVar1 = std::operator<<(poVar1,pcVar4);
  std::operator<<(poVar1,";\n");
  std::operator<<((ostream *)poVar5,"\tmediump vec3 res = vec3(0.0);\n\n");
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &params._M_t._M_impl.super__Rb_tree_header._M_header;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  params._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  params._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       params._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c0,"CONDITION",(allocator<char> *)&local_3a0);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&params,&local_3c0);
  std::__cxx11::string::assign((char *)pmVar2);
  std::__cxx11::string::~string((string *)&local_3c0);
  pcVar4 = deqp::gls::LineStream::str(switchBody);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,pcVar4,&local_3c1);
  tcu::StringTemplate::StringTemplate(&local_3a0,&local_370);
  tcu::StringTemplate::specialize(&local_3c0,&local_3a0,&params);
  std::operator<<((ostream *)poVar5,local_3c0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_3c0);
  tcu::StringTemplate::~StringTemplate(&local_3a0);
  std::__cxx11::string::~string((string *)&local_370);
  std::operator<<((ostream *)poVar5,"\n");
  if (isVertex) {
    std::operator<<((ostream *)&vtx,"\tv_color = vec4(res, 1.0);\n");
    pcVar4 = "\to_color = v_color;\n";
  }
  else {
    std::operator<<((ostream *)&vtx,"\tv_coords = a_coords;\n");
    pcVar4 = "\to_color = vec4(res, 1.0);\n";
  }
  std::operator<<((ostream *)&frag,pcVar4);
  std::operator<<((ostream *)&vtx,"}\n");
  std::operator<<((ostream *)&frag,"}\n");
  this = (ShaderSwitchCase *)operator_new(0x128);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  pcVar3 = evalSwitchUniform;
  if (type == SWITCHTYPE_STATIC) {
    pcVar3 = evalSwitchStatic;
  }
  evalFunc = (ShaderEvalFunc)0x0;
  if (type == SWITCHTYPE_DYNAMIC) {
    evalFunc = evalSwitchDynamic;
  }
  if (type < SWITCHTYPE_DYNAMIC) {
    evalFunc = pcVar3;
  }
  ShaderSwitchCase::ShaderSwitchCase
            (this,context,local_380,local_378,isVertex,local_3c0._M_dataplus._M_p,
             local_3a0.m_template._M_dataplus._M_p,evalFunc);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&params._M_t);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vtx);
  return (TestCase *)this;
}

Assistant:

static tcu::TestCase* makeSwitchCase (Context& context, const char* name, const char* desc, SwitchType type, bool isVertex, const LineStream& switchBody)
{
	std::ostringstream	vtx;
	std::ostringstream	frag;
	std::ostringstream&	op		= isVertex ? vtx : frag;

	vtx << "#version 300 es\n"
		<< "in highp vec4 a_position;\n"
		<< "in highp vec4 a_coords;\n";
	frag << "#version 300 es\n"
		 << "layout(location = 0) out mediump vec4 o_color;\n";

	if (isVertex)
	{
		vtx << "out mediump vec4 v_color;\n";
		frag << "in mediump vec4 v_color;\n";
	}
	else
	{
		vtx << "out highp vec4 v_coords;\n";
		frag << "in highp vec4 v_coords;\n";
	}

	if (type == SWITCHTYPE_UNIFORM)
		op << "uniform highp int ui_two;\n";

	vtx << "\n"
		<< "void main (void)\n"
		<< "{\n"
		<< "	gl_Position = a_position;\n";
	frag << "\n"
		 << "void main (void)\n"
		 << "{\n";

	// Setup.
	op << "	highp vec4 coords = " << (isVertex ? "a_coords" : "v_coords") << ";\n";
	op << "	mediump vec3 res = vec3(0.0);\n\n";

	// Switch body.
	map<string, string> params;
	params["CONDITION"] = type == SWITCHTYPE_STATIC		? "2"								:
						  type == SWITCHTYPE_UNIFORM	? "ui_two"							:
						  type == SWITCHTYPE_DYNAMIC	? "int(floor(coords.z*1.5 + 2.0))"	: "???";

	op << tcu::StringTemplate(switchBody.str()).specialize(params).c_str();
	op << "\n";

	if (isVertex)
	{
		vtx << "	v_color = vec4(res, 1.0);\n";
		frag << "	o_color = v_color;\n";
	}
	else
	{
		vtx << "	v_coords = a_coords;\n";
		frag << "	o_color = vec4(res, 1.0);\n";
	}

	vtx << "}\n";
	frag << "}\n";

	return new ShaderSwitchCase(context, name, desc, isVertex, vtx.str().c_str(), frag.str().c_str(),
								type == SWITCHTYPE_STATIC	? evalSwitchStatic	:
								type == SWITCHTYPE_UNIFORM	? evalSwitchUniform	:
								type == SWITCHTYPE_DYNAMIC	? evalSwitchDynamic	: (ShaderEvalFunc)DE_NULL);
}